

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O2

vector<IContainedElement_*,_std::allocator<IContainedElement_*>_> * __thiscall
DataContainer::GetFileList
          (vector<IContainedElement_*,_std::allocator<IContainedElement_*>_> *__return_storage_ptr__
          ,DataContainer *this)

{
  int iVar1;
  pointer __x;
  
  (__return_storage_ptr__->
  super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (__x = (this->file_list_).
             super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>._M_impl.
             super__Vector_impl_data._M_start;
      __x < (this->file_list_).
            super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>._M_impl.
            super__Vector_impl_data._M_finish; __x = __x + 1) {
    iVar1 = (*(*__x)->_vptr_IContainedElement[2])();
    if (iVar1 != 0) {
      std::vector<IContainedElement_*,_std::allocator<IContainedElement_*>_>::push_back
                (__return_storage_ptr__,__x);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<IContainedElement*> DataContainer::GetFileList()
{
   std::vector<IContainedElement*> out_list;

   //
   for (std::vector<IContainedElement*>::iterator it = file_list_.begin(); it < file_list_.end(); ++it)
   {
      if ((*it)->GetType() != 0)
      {
         out_list.push_back(*it);
      }
   }

   return out_list;
}